

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * escapestring(char *s)

{
  vector<char> *this;
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  uint uVar3;
  char *v;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (escapestring(char_const*)::strbuf == '\0') {
    iVar2 = __cxa_guard_acquire(&escapestring(char_const*)::strbuf);
    if (iVar2 != 0) {
      escapestring::strbuf[2] = (vector<char>)ZEXT816(0);
      escapestring::strbuf[1] = (vector<char>)ZEXT816(0);
      escapestring::strbuf[0] = (vector<char>)ZEXT816(0);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&escapestring(char_const*)::strbuf);
    }
  }
  escapestring::stridx = (escapestring::stridx + 1U) % 3;
  uVar3 = escapestring::stridx << 4;
  *(undefined4 *)((long)&escapestring::strbuf[0].ulen + (ulong)uVar3) = 0;
  this = (vector<char> *)((long)&escapestring::strbuf[0].buf + (ulong)uVar3);
  uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  vector<char>::add(this,(char *)((long)&uStack_38 + 7));
  do {
    cVar1 = *s;
    if (cVar1 == '\t') {
      v = "^t";
LAB_0012d713:
      vector<char>::put(this,v,2);
    }
    else {
      if (cVar1 == '\n') {
        v = "^n";
        goto LAB_0012d713;
      }
      if (cVar1 == '\f') {
        v = "^f";
        goto LAB_0012d713;
      }
      if (cVar1 == '\"') {
        v = "^\"";
        goto LAB_0012d713;
      }
      if (cVar1 == '^') {
        v = "^^";
        goto LAB_0012d713;
      }
      if (cVar1 == '\0') {
        vector<char>::put(this,"\"",2);
        return this->buf;
      }
      vector<char>::add(this,s);
    }
    s = s + 1;
  } while( true );
}

Assistant:

const char *escapestring(const char *s)
{
    static vector<char> strbuf[3];
    static int stridx = 0;
    stridx = (stridx + 1)%3;
    vector<char> &buf = strbuf[stridx];
    buf.setsize(0);
    buf.add('"');
    for(; *s; s++) switch(*s)
    {
        case '\n': buf.put("^n", 2); break;
        case '\t': buf.put("^t", 2); break;
        case '\f': buf.put("^f", 2); break;
        case '"': buf.put("^\"", 2); break;
        case '^': buf.put("^^", 2); break;
        default: buf.add(*s); break;
    }
    buf.put("\"\0", 2);
    return buf.getbuf();
}